

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void * array_create(int initsize,int elemsize)

{
  int *piVar1;
  
  piVar1 = (int *)malloc((long)elemsize * (long)initsize + 8);
  *piVar1 = initsize;
  piVar1[1] = elemsize & 0xf;
  return piVar1 + 2;
}

Assistant:

void *
array_create(
    int initsize,
    int elemsize )
{
    array_t * handle;
    handle = (array_t *)malloc( sizeof(array_t) + (size_t)elemsize * initsize );
    assert( handle != NULL );
    handle->size = initsize;
    handle->elemsize = elemsize;
    handle->numelem = 0;
    return _ARRAY(handle);
}